

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O3

void __thiscall
InstructionVMEvalContext::StackFrame::AssignRegister(StackFrame *this,uint id,VmConstant *constant)

{
  uint newSize;
  uint uVar1;
  
  if (id == 0) {
    __assert_fail("id != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmEval.cpp"
                  ,0x80,
                  "void InstructionVMEvalContext::StackFrame::AssignRegister(unsigned int, VmConstant *)"
                 );
  }
  uVar1 = (this->instructionValues).count;
  if (uVar1 < id) {
    newSize = id + 0x20;
    if ((this->instructionValues).max <= newSize) {
      SmallArray<VmConstant_*,_32U>::grow(&this->instructionValues,newSize);
    }
    (this->instructionValues).count = newSize;
    if (newSize < uVar1 || newSize - uVar1 == 0) goto LAB_00287610;
    memset((this->instructionValues).data + uVar1,0,(ulong)(newSize - uVar1) << 3);
    uVar1 = (this->instructionValues).count;
  }
  if (id - 1 < uVar1) {
    (this->instructionValues).data[id - 1] = constant;
    return;
  }
LAB_00287610:
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x199,
                "T &SmallArray<VmConstant *, 32>::operator[](unsigned int) [T = VmConstant *, N = 32]"
               );
}

Assistant:

void InstructionVMEvalContext::StackFrame::AssignRegister(unsigned id, VmConstant *constant)
{
	assert(id != 0);

	unsigned oldSize = instructionValues.size();
	unsigned newSize = id;

	if(newSize > oldSize)
	{
		instructionValues.resize(newSize + 32);

		memset(&instructionValues[oldSize], 0, (instructionValues.size() - oldSize) * sizeof(instructionValues[0]));
	}

	instructionValues[id - 1] = constant;
}